

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O2

char * s3get_gvn_fattr(char *a)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (*(char **)((long)attrib + lVar3) == (char *)0x0) {
      if (*(long *)((long)value + lVar3) == 0) {
        return (char *)0x0;
      }
      __assert_fail("(attrib[i] != NULL) || (value[i] == NULL)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                    ,0x5f,"char *s3get_gvn_fattr(char *)");
    }
    iVar2 = strcmp(*(char **)((long)attrib + lVar3),a);
    lVar1 = lVar3 + 8;
  } while (iVar2 != 0);
  return *(char **)((long)value + lVar3);
}

Assistant:

char *
s3get_gvn_fattr(char *a)
{
    int i;

    for (i = 0; attrib[i] && strcmp(attrib[i], a) != 0; i++);

    /* value for sentinel is null as well */
    assert((attrib[i] != NULL) || (value[i] == NULL));

    return value[i];
}